

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.cpp
# Opt level: O1

void __thiscall chrono::ChLinkMarkers::ArchiveOUT(ChLinkMarkers *this,ChArchiveOut *marchive)

{
  char *local_38;
  int *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkMarkers>(marchive);
  ChLink::ArchiveOUT(&this->super_ChLink,marchive);
  local_30 = &this->markID1;
  local_38 = "markID1";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive,&local_38);
  local_30 = &this->markID2;
  local_38 = "markID2";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[3])(marchive,&local_38);
  return;
}

Assistant:

void ChLinkMarkers::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkMarkers>();

    // serialize parent class
    ChLink::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(markID1);
    marchive << CHNVP(markID2);
}